

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall BackendBase::setDefaultChannelOrder(BackendBase *this)

{
  reference pvVar1;
  array<unsigned_int,_16UL> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  value_type *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  
  uVar2 = 0xffffffff;
  std::array<unsigned_int,_16UL>::fill
            ((array<unsigned_int,_16UL> *)CONCAT44(0xffffffff,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8);
  switch(*(undefined1 *)(*(long *)(in_RDI->_M_elems + 2) + 0x18)) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 6:
    setDefaultWFXChannelOrder((BackendBase *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
    break;
  case 5:
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 0;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 1;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 2;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 3;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 4;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 5;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 6;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 7;
    break;
  case 7:
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 0;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 1;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 2;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 3;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 4;
    pvVar1 = std::array<unsigned_int,_16UL>::operator[](in_RDI,in_stack_ffffffffffffffd8);
    *pvVar1 = 5;
  }
  return;
}

Assistant:

void BackendBase::setDefaultChannelOrder()
{
    mDevice->RealOut.ChannelIndex.fill(INVALID_CHANNEL_INDEX);

    switch(mDevice->FmtChans)
    {
    case DevFmtX51Rear:
        mDevice->RealOut.ChannelIndex[FrontLeft]   = 0;
        mDevice->RealOut.ChannelIndex[FrontRight]  = 1;
        mDevice->RealOut.ChannelIndex[BackLeft]    = 2;
        mDevice->RealOut.ChannelIndex[BackRight]   = 3;
        mDevice->RealOut.ChannelIndex[FrontCenter] = 4;
        mDevice->RealOut.ChannelIndex[LFE]         = 5;
        return;
    case DevFmtX71:
        mDevice->RealOut.ChannelIndex[FrontLeft]   = 0;
        mDevice->RealOut.ChannelIndex[FrontRight]  = 1;
        mDevice->RealOut.ChannelIndex[BackLeft]    = 2;
        mDevice->RealOut.ChannelIndex[BackRight]   = 3;
        mDevice->RealOut.ChannelIndex[FrontCenter] = 4;
        mDevice->RealOut.ChannelIndex[LFE]         = 5;
        mDevice->RealOut.ChannelIndex[SideLeft]    = 6;
        mDevice->RealOut.ChannelIndex[SideRight]   = 7;
        return;

    /* Same as WFX order */
    case DevFmtMono:
    case DevFmtStereo:
    case DevFmtQuad:
    case DevFmtX51:
    case DevFmtX61:
    case DevFmtAmbi3D:
        setDefaultWFXChannelOrder();
        break;
    }
}